

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O0

int TRUST_TOKEN_CLIENT_add_key
              (TRUST_TOKEN_CLIENT *ctx,size_t *out_key_index,uint8_t *key,size_t key_len)

{
  _func_int_TRUST_TOKEN_CLIENT_KEY_ptr_uint8_t_ptr_size_t *p_Var1;
  int iVar2;
  TRUST_TOKEN_CLIENT_KEY *pTVar3;
  uint8_t *puVar4;
  size_t sVar5;
  uint32_t local_4c;
  undefined1 local_48 [4];
  uint32_t key_id;
  CBS cbs;
  trust_token_client_key_st *key_s;
  size_t key_len_local;
  uint8_t *key_local;
  size_t *out_key_index_local;
  TRUST_TOKEN_CLIENT *ctx_local;
  
  if ((ctx->num_keys == 6) || (ctx->method->max_keys <= ctx->num_keys)) {
    ERR_put_error(0x20,0,0x6b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                  ,0xe7);
  }
  else {
    cbs.len = (size_t)(ctx->keys + ctx->num_keys);
    CBS_init((CBS *)local_48,key,key_len);
    iVar2 = CBS_get_u32((CBS *)local_48,&local_4c);
    if (iVar2 != 0) {
      p_Var1 = ctx->method->client_key_from_bytes;
      pTVar3 = (TRUST_TOKEN_CLIENT_KEY *)(cbs.len + 8);
      puVar4 = CBS_data((CBS *)local_48);
      sVar5 = CBS_len((CBS *)local_48);
      iVar2 = (*p_Var1)(pTVar3,puVar4,sVar5);
      if (iVar2 != 0) {
        *(uint32_t *)cbs.len = local_4c;
        *out_key_index = ctx->num_keys;
        ctx->num_keys = ctx->num_keys + 1;
        return 1;
      }
    }
    ERR_put_error(0x20,0,0x69,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                  ,0xf2);
  }
  return 0;
}

Assistant:

int TRUST_TOKEN_CLIENT_add_key(TRUST_TOKEN_CLIENT *ctx, size_t *out_key_index,
                               const uint8_t *key, size_t key_len) {
  if (ctx->num_keys == OPENSSL_ARRAY_SIZE(ctx->keys) ||
      ctx->num_keys >= ctx->method->max_keys) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_TOO_MANY_KEYS);
    return 0;
  }

  struct trust_token_client_key_st *key_s = &ctx->keys[ctx->num_keys];
  CBS cbs;
  CBS_init(&cbs, key, key_len);
  uint32_t key_id;
  if (!CBS_get_u32(&cbs, &key_id) ||
      !ctx->method->client_key_from_bytes(&key_s->key, CBS_data(&cbs),
                                          CBS_len(&cbs))) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    return 0;
  }
  key_s->id = key_id;
  *out_key_index = ctx->num_keys;
  ctx->num_keys += 1;
  return 1;
}